

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void InterpolateRow_C(uint8_t *dst_ptr,uint8_t *src_ptr,ptrdiff_t src_stride,int width,
                     int source_y_fraction)

{
  ulong uVar1;
  byte *pbVar2;
  long lVar3;
  int y1_fraction;
  int iVar4;
  
  if (source_y_fraction == 0) {
    memcpy(dst_ptr,src_ptr,(long)width);
    return;
  }
  if (source_y_fraction == 0x80) {
    if (0 < width) {
      uVar1 = 0;
      do {
        dst_ptr[uVar1] =
             (uint8_t)((uint)src_ptr[uVar1] + (uint)src_ptr[uVar1 + src_stride] + 1 >> 1);
        uVar1 = uVar1 + 1;
      } while ((uint)width != uVar1);
    }
    return;
  }
  iVar4 = 0x100 - source_y_fraction;
  pbVar2 = src_ptr + src_stride;
  if (1 < width) {
    lVar3 = 0;
    do {
      dst_ptr[lVar3] =
           (uint8_t)((uint)pbVar2[lVar3] * source_y_fraction + (uint)src_ptr[lVar3] * iVar4 + 0x80
                    >> 8);
      dst_ptr[lVar3 + 1] =
           (uint8_t)((uint)pbVar2[lVar3 + 1] * source_y_fraction + (uint)src_ptr[lVar3 + 1] * iVar4
                     + 0x80 >> 8);
      lVar3 = lVar3 + 2;
    } while ((int)lVar3 < width + -1);
    pbVar2 = pbVar2 + lVar3;
    dst_ptr = dst_ptr + lVar3;
    src_ptr = src_ptr + lVar3;
  }
  if ((width & 1U) != 0) {
    *dst_ptr = (uint8_t)((uint)*pbVar2 * source_y_fraction + iVar4 * (uint)*src_ptr + 0x80 >> 8);
  }
  return;
}

Assistant:

void InterpolateRow_C(uint8_t* dst_ptr,
                      const uint8_t* src_ptr,
                      ptrdiff_t src_stride,
                      int width,
                      int source_y_fraction) {
  int y1_fraction = source_y_fraction;
  int y0_fraction = 256 - y1_fraction;
  const uint8_t* src_ptr1 = src_ptr + src_stride;
  int x;
  if (y1_fraction == 0) {
    memcpy(dst_ptr, src_ptr, width);
    return;
  }
  if (y1_fraction == 128) {
    HalfRow_C(src_ptr, src_stride, dst_ptr, width);
    return;
  }
  for (x = 0; x < width - 1; x += 2) {
    dst_ptr[0] =
        (src_ptr[0] * y0_fraction + src_ptr1[0] * y1_fraction + 128) >> 8;
    dst_ptr[1] =
        (src_ptr[1] * y0_fraction + src_ptr1[1] * y1_fraction + 128) >> 8;
    src_ptr += 2;
    src_ptr1 += 2;
    dst_ptr += 2;
  }
  if (width & 1) {
    dst_ptr[0] =
        (src_ptr[0] * y0_fraction + src_ptr1[0] * y1_fraction + 128) >> 8;
  }
}